

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_frint_mode(DisasContext_conflict1 *s,arg_rpr_esz *a,int mode)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  TCGv_i32 retval;
  TCGv_ptr arg2;
  TCGv_ptr status;
  TCGv_i32 tmode;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  int mode_local;
  arg_rpr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (a->esz == 0) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      oprsz = vec_full_reg_size(s);
      retval = tcg_const_i32_aarch64(tcg_ctx_00,mode);
      arg2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,a->esz == 1);
      gen_helper_set_rmode(tcg_ctx_00,retval,retval,arg2);
      dofs = vec_full_reg_offset(s,a->rd);
      aofs = vec_full_reg_offset(s,a->rn);
      bofs = pred_full_reg_offset(s,a->pg);
      tcg_gen_gvec_3_ptr_aarch64
                (tcg_ctx_00,dofs,aofs,bofs,arg2,oprsz,oprsz,0,frint_fns[a->esz + -1]);
      gen_helper_set_rmode(tcg_ctx_00,retval,retval,arg2);
      tcg_temp_free_i32(tcg_ctx_00,retval);
      tcg_temp_free_ptr(tcg_ctx_00,arg2);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool do_frint_mode(DisasContext *s, arg_rpr_esz *a, int mode)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_i32 tmode = tcg_const_i32(tcg_ctx, mode);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);

        gen_helper_set_rmode(tcg_ctx, tmode, tmode, status);

        tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           pred_full_reg_offset(s, a->pg),
                           status, vsz, vsz, 0, frint_fns[a->esz - 1]);

        gen_helper_set_rmode(tcg_ctx, tmode, tmode, status);
        tcg_temp_free_i32(tcg_ctx, tmode);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}